

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traceback_template.c
# Opt level: O0

void parasail_traceback_8
               (char *seqA,int lena,char *seqB,int lenb,char *nameA,char *nameB,
               parasail_matrix_t *matrix,parasail_result_t *result,char match,char pos,char neg,
               int width,int name_width,int use_stats,int int_width,FILE *stream,int case_sensitive,
               char *alphabet_aliases_)

{
  int *piVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *__s;
  char *__s_00;
  char *__s_01;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  char *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  char local_27c;
  size_t local_278;
  size_t local_270;
  long local_268;
  int64_t di;
  int64_t ai;
  int64_t qi;
  int64_t d_pindex;
  int64_t q_pindex;
  int64_t len;
  int64_t gap;
  int64_t sim;
  int64_t mch;
  char *dr;
  char *ar;
  char *qr;
  int64_t loc;
  char *pcStack_1f8;
  int k;
  size_t i_1;
  char local_1e8 [4];
  int _int_width;
  char tmp [32];
  int64_t namelenB;
  int64_t namelenA;
  int8_t *HT;
  int64_t c_del;
  int64_t c_ins;
  long lStack_190;
  int where;
  int64_t j;
  int64_t i;
  char *ac;
  char *dc;
  char *qc;
  char *a;
  char *d;
  char *q;
  size_t aliases_size;
  char alphabet_aliases [256];
  char *nameB_local;
  char *nameA_local;
  int lenb_local;
  char *seqB_local;
  int lena_local;
  char *seqA_local;
  
  q = (char *)0x0;
  alphabet_aliases._248_8_ = nameB;
  __s = (char *)malloc((long)(lena + lenb + 1));
  __s_00 = (char *)malloc((long)(lena + lenb + 1));
  __s_01 = (char *)malloc((long)(lena + lenb + 1));
  j = (int64_t)result->end_query;
  lStack_190 = (long)result->end_ref;
  c_ins._4_4_ = 4;
  c_del = 0;
  HT = (int8_t *)0x0;
  piVar1 = ((result->field_4).rowcols)->score_row;
  if (nameA == (char *)0x0) {
    local_270 = 0;
  }
  else {
    local_270 = strlen(nameA);
  }
  if (alphabet_aliases._248_8_ == 0) {
    local_278 = 0;
  }
  else {
    local_278 = strlen((char *)alphabet_aliases._248_8_);
  }
  if (alphabet_aliases_ != (char *)0x0) {
    q = (char *)strlen(alphabet_aliases_);
    if ((((ulong)q & 1) != 0) || ((char *)0xff < q)) {
      fprintf(_stderr,"%s: assert(%s) failed\n","parasail_traceback_8",
              "aliases_size % 2 == 0 && aliases_size < 256");
      return;
    }
    for (pcStack_1f8 = (char *)0x0; pcStack_1f8 < q; pcStack_1f8 = pcStack_1f8 + 1) {
      if (case_sensitive == 0) {
        iVar4 = toupper((int)alphabet_aliases_[(long)pcStack_1f8]);
        local_27c = (char)iVar4;
      }
      else {
        local_27c = alphabet_aliases_[(long)pcStack_1f8];
      }
      *(char *)((long)&aliases_size + (long)pcStack_1f8) = local_27c;
    }
  }
  iVar4 = snprintf(local_1e8,0x20,"%llu",(long)lena + (long)lenb);
  if (int_width < iVar4) {
    int_width = iVar4;
  }
  i = (int64_t)__s_01;
  ac = __s_00;
  dc = __s;
  if ((result->flag & 2U) != 0) {
    if (result->end_query + 1 == lena) {
      for (loc._4_4_ = lenb + -1; lStack_190 < loc._4_4_; loc._4_4_ = loc._4_4_ + -1) {
        c_del = c_del + 1;
        *dc = '-';
        *ac = seqB[loc._4_4_];
        *(undefined1 *)i = 0x20;
        i = i + 1;
        ac = ac + 1;
        dc = dc + 1;
      }
    }
    else {
      if (result->end_ref + 1 != lenb) {
        fprintf(_stderr,"%s: assert(%s) failed\n","parasail_traceback_8","0 && \"internal error\"");
        return;
      }
      for (loc._4_4_ = lena + -1; j < loc._4_4_; loc._4_4_ = loc._4_4_ + -1) {
        HT = HT + 1;
        cVar3 = missing_char(seqA,loc._4_4_);
        *dc = cVar3;
        *ac = '-';
        *(undefined1 *)i = 0x20;
        i = i + 1;
        ac = ac + 1;
        dc = dc + 1;
      }
    }
  }
  do {
    if (j < 0 && lStack_190 < 0) {
LAB_00585999:
      *dc = '\0';
      *ac = '\0';
      *(undefined1 *)i = 0;
      sim = 0;
      gap = 0;
      len = 0;
      sVar6 = strlen(__s_01);
      ai = 0;
      di = 0;
      local_268 = 0;
      if ((result->flag & 4U) == 0) {
        d_pindex = 0;
        qi = 0;
      }
      else {
        d_pindex = ((long)(result->end_query + 1) - sVar6) + c_del;
        qi = (int64_t)(HT + ((long)(result->end_ref + 1) - sVar6));
      }
      sVar7 = strlen(__s);
      __ptr = parasail_reverse(__s,sVar7);
      sVar7 = strlen(__s_01);
      __ptr_00 = parasail_reverse(__s_01,sVar7);
      sVar7 = strlen(__s_00);
      __ptr_01 = parasail_reverse(__s_00,sVar7);
      j = 0;
      do {
        if ((long)sVar6 <= j) {
          if (use_stats != 0) {
            fprintf((FILE *)stream,"\n");
            fprintf((FILE *)stream,"Length: %lld\n",sVar6);
            fprintf((FILE *)stream,"Identity:   %*lld/%lld (%4.1f%%)\n",
                    ((double)sim * 100.0) / (double)(long)sVar6,(ulong)(uint)int_width,sim,sVar6);
            fprintf((FILE *)stream,"Similarity: %*lld/%lld (%4.1f%%)\n",
                    ((double)gap * 100.0) / (double)(long)sVar6,(ulong)(uint)int_width,gap,sVar6);
            fprintf((FILE *)stream,"Gaps:       %*lld/%lld (%4.1f%%)\n",
                    ((double)len * 100.0) / (double)(long)sVar6,(ulong)(uint)int_width,len,sVar6);
            fprintf((FILE *)stream,"Score: %d\n",(ulong)(uint)result->score);
          }
          free(__ptr);
          free(__ptr_00);
          free(__ptr_01);
          free(__s);
          free(__s_00);
          free(__s_01);
          return;
        }
        fprintf((FILE *)stream,"\n");
        for (lStack_190 = 0; (lStack_190 < name_width && (lStack_190 < (long)local_278));
            lStack_190 = lStack_190 + 1) {
          fprintf((FILE *)stream,"%c",
                  (ulong)(uint)(int)*(char *)(alphabet_aliases._248_8_ + lStack_190));
        }
        for (; lStack_190 < name_width; lStack_190 = lStack_190 + 1) {
          fprintf((FILE *)stream," ");
        }
        fprintf((FILE *)stream," %*lld ",(ulong)(uint)int_width,qi + 1);
        lStack_190 = 0;
        while( true ) {
          bVar2 = false;
          if ((lStack_190 < (long)sVar6) && (bVar2 = false, lStack_190 < width)) {
            bVar2 = local_268 < (long)sVar6;
          }
          if (!bVar2) break;
          if (__ptr_01[local_268] != '-') {
            qi = qi + 1;
          }
          fprintf((FILE *)stream,"%c",(ulong)(uint)(int)__ptr_01[local_268]);
          local_268 = local_268 + 1;
          lStack_190 = lStack_190 + 1;
        }
        fprintf((FILE *)stream," %*lld\n",(ulong)(uint)int_width,qi);
        for (lStack_190 = 0; lStack_190 < name_width + int_width + 2; lStack_190 = lStack_190 + 1) {
          fprintf((FILE *)stream," ");
        }
        lStack_190 = 0;
        while( true ) {
          bVar2 = false;
          if ((lStack_190 < (long)sVar6) && (bVar2 = false, lStack_190 < width)) {
            bVar2 = di < (long)sVar6;
          }
          if (!bVar2) break;
          if (__ptr_00[di] == match) {
            sim = sim + 1;
            gap = gap + 1;
          }
          else if (__ptr_00[di] == pos) {
            gap = gap + 1;
          }
          else if (__ptr_00[di] != neg) {
            if (__ptr_00[di] != ' ') {
              fprintf(_stderr,"bad char in traceback \'%c\'\n",(ulong)(uint)(int)__ptr_00[di]);
              fprintf(_stderr,"%s: assert(%s) failed\n","parasail_traceback_8",
                      "0 && \"internal error\"");
              return;
            }
            len = len + 1;
          }
          fprintf((FILE *)stream,"%c",(ulong)(uint)(int)__ptr_00[di]);
          di = di + 1;
          lStack_190 = lStack_190 + 1;
        }
        fprintf((FILE *)stream,"\n");
        for (lStack_190 = 0; (lStack_190 < name_width && (lStack_190 < (long)local_270));
            lStack_190 = lStack_190 + 1) {
          fprintf((FILE *)stream,"%c",(ulong)(uint)(int)nameA[lStack_190]);
        }
        for (; lStack_190 < name_width; lStack_190 = lStack_190 + 1) {
          fprintf((FILE *)stream," ");
        }
        fprintf((FILE *)stream," %*lld ",(ulong)(uint)int_width,d_pindex + 1);
        lStack_190 = 0;
        while( true ) {
          bVar2 = false;
          if ((lStack_190 < (long)sVar6) && (bVar2 = false, lStack_190 < width)) {
            bVar2 = ai < (long)sVar6;
          }
          if (!bVar2) break;
          if (__ptr[ai] != '-') {
            d_pindex = d_pindex + 1;
          }
          fprintf((FILE *)stream,"%c",(ulong)(uint)(int)__ptr[ai]);
          ai = ai + 1;
          lStack_190 = lStack_190 + 1;
        }
        fprintf((FILE *)stream," %*lld\n",(ulong)(uint)int_width,d_pindex);
        j = width + j;
      } while( true );
    }
    lVar5 = j * lenb + lStack_190;
    if (j < 0) {
      if ((result->flag & 4U) == 0) {
        for (; -1 < lStack_190; lStack_190 = lStack_190 + -1) {
          c_del = c_del + 1;
          *dc = '-';
          *ac = seqB[lStack_190];
          *(undefined1 *)i = 0x20;
          i = i + 1;
          ac = ac + 1;
          dc = dc + 1;
        }
      }
      goto LAB_00585999;
    }
    if (lStack_190 < 0) {
      if ((result->flag & 4U) == 0) {
        for (; -1 < j; j = j + -1) {
          HT = HT + 1;
          cVar3 = missing_char(seqA,(int)j);
          *dc = cVar3;
          *ac = '-';
          *(undefined1 *)i = 0x20;
          i = i + 1;
          ac = ac + 1;
          dc = dc + 1;
        }
      }
      goto LAB_00585999;
    }
    iVar4 = (int)j;
    if (c_ins._4_4_ == 4) {
      if ((*(byte *)((long)piVar1 + lVar5) & 4) == 0) {
        if ((*(byte *)((long)piVar1 + lVar5) & 1) == 0) {
          if ((*(byte *)((long)piVar1 + lVar5) & 2) == 0) goto LAB_00585999;
          c_ins._4_4_ = 2;
        }
        else {
          c_ins._4_4_ = 1;
        }
      }
      else {
        cVar3 = missing_char(seqA,iVar4);
        *dc = cVar3;
        *ac = seqB[lStack_190];
        cVar3 = match_char(seqA,iVar4,seqB,(int)lStack_190,matrix,match,pos,neg,case_sensitive,
                           (char *)&aliases_size,(size_t)q);
        *(char *)i = cVar3;
        j = j + -1;
        lStack_190 = lStack_190 + -1;
        i = i + 1;
        ac = ac + 1;
        dc = dc + 1;
      }
    }
    else {
      if (c_ins._4_4_ == 1) {
        c_del = c_del + 1;
        *dc = '-';
        *ac = seqB[lStack_190];
        *(undefined1 *)i = 0x20;
        lStack_190 = lStack_190 + -1;
        if ((*(byte *)((long)piVar1 + lVar5) & 8) == 0) {
          if ((*(byte *)((long)piVar1 + lVar5) & 0x10) == 0) {
            fprintf(_stderr,"%s: assert(%s) failed\n","parasail_traceback_8",
                    "0 && \"internal error\"");
            return;
          }
          c_ins._4_4_ = 1;
        }
        else {
          c_ins._4_4_ = 4;
        }
      }
      else {
        if (c_ins._4_4_ != 2) {
          if (c_ins._4_4_ != 0) {
            fprintf(_stderr,"%s: assert(%s) failed\n","parasail_traceback_8",
                    "0 && \"internal error\"");
            return;
          }
          goto LAB_00585999;
        }
        HT = HT + 1;
        cVar3 = missing_char(seqA,iVar4);
        *dc = cVar3;
        *ac = '-';
        *(undefined1 *)i = 0x20;
        j = j + -1;
        if ((*(byte *)((long)piVar1 + lVar5) & 0x20) == 0) {
          if ((*(byte *)((long)piVar1 + lVar5) & 0x40) == 0) {
            fprintf(_stderr,"%s: assert(%s) failed\n","parasail_traceback_8",
                    "0 && \"internal error\"");
            return;
          }
          c_ins._4_4_ = 2;
        }
        else {
          c_ins._4_4_ = 4;
        }
      }
      dc = dc + 1;
      ac = ac + 1;
      i = i + 1;
    }
  } while( true );
}

Assistant:

static inline void CONCAT(NAME, T) (
        const char *seqA,
        int lena,
        const char *seqB,
        int lenb,
        const char *nameA,
        const char *nameB,
        const parasail_matrix_t *matrix,
        parasail_result_t *result,
        char match, char pos, char neg,
        int width,
        int name_width,
        int use_stats,
        int int_width,
        FILE *stream,
        int case_sensitive,
        const char *alphabet_aliases_)
{
    char alphabet_aliases[256];
    size_t aliases_size = 0;
    char *q = malloc(sizeof(char)*(lena+lenb+1));
    char *d = malloc(sizeof(char)*(lena+lenb+1));
    char *a = malloc(sizeof(char)*(lena+lenb+1));
    char *qc = q;
    char *dc = d;
    char *ac = a;
    int64_t i = result->end_query;
    int64_t j = result->end_ref;
    int where = PARASAIL_DIAG;
    int64_t c_ins = 0;
    int64_t c_del = 0;
    D *HT = (D*)result->trace->trace_table;
    int64_t namelenA = (NULL == nameA) ? 0 : (int64_t)strlen(nameA);
    int64_t namelenB = (NULL == nameB) ? 0 : (int64_t)strlen(nameB);
    char tmp[32];
    int _int_width = 0;
#if defined(STRIPED)
    int64_t segWidth = 0;
    int64_t segLen = 0;
    if (result->flag & PARASAIL_FLAG_LANES_1) {
        segWidth = 1;
    }
    if (result->flag & PARASAIL_FLAG_LANES_2) {
        segWidth = 2;
    }
    if (result->flag & PARASAIL_FLAG_LANES_4) {
        segWidth = 4;
    }
    if (result->flag & PARASAIL_FLAG_LANES_8) {
        segWidth = 8;
    }
    if (result->flag & PARASAIL_FLAG_LANES_16) {
        segWidth = 16;
    }
    if (result->flag & PARASAIL_FLAG_LANES_32) {
        segWidth = 32;
    }
    if (result->flag & PARASAIL_FLAG_LANES_64) {
        segWidth = 64;
    }
    segLen = (lena + segWidth - 1) / segWidth;
#endif
    if (NULL != alphabet_aliases_) {
        size_t i;
        aliases_size = strlen(alphabet_aliases_);
        PARASAIL_ASSERT_NORETVAL(aliases_size % 2 == 0 && aliases_size < 256); // even number of characters in alias
        for (i=0; i<aliases_size; ++i) {
            alphabet_aliases[i] = case_sensitive ? alphabet_aliases_[i] :
                                                   toupper(alphabet_aliases_[i]);
        }
    }
    /* how wide does our index label need to be? */
    _int_width = snprintf(tmp, 32, "%llu", (unsigned long long)lena+(unsigned long long)lenb);
    /* if requested int width is too small, override it */
    if (int_width < _int_width) {
        int_width = _int_width;
    }
    /* semi-global alignment includes the end gaps */
    if (result->flag & PARASAIL_FLAG_SG) {
        int k;
        if (result->end_query+1 == lena) {
            k = lenb-1;
            while (k > j) {
                ++c_ins;
                *(qc++) = '-';
                *(dc++) = seqB[k];
                *(ac++) = ' ';
                --k;
            }
        }
        else if (result->end_ref+1 == lenb) {
            k = lena-1;
            while (k > i) {
                ++c_del;
                *(qc++) = missing_char(seqA, k);
                *(dc++) = '-';
                *(ac++) = ' ';
                --k;
            }
        }
        else {
            PARASAIL_ASSERT_NORETVAL(0 && "internal error");
        }
    }
    while (i >= 0 || j >= 0) {
        LOC
        if (i < 0) {
            if (!(result->flag & PARASAIL_FLAG_SW)) {
                while (j >= 0) {
                    ++c_ins;
                    *(qc++) = '-';
                    *(dc++) = seqB[j];
                    *(ac++) = ' ';
                    --j;
                }
            }
            break;
        }
        if (j < 0) {
            if (!(result->flag & PARASAIL_FLAG_SW)) {
                while (i >= 0) {
                    ++c_del;
                    *(qc++) = missing_char(seqA, i);
                    *(dc++) = '-';
                    *(ac++) = ' ';
                    --i;
                }
            }
            break;
        }
        if (PARASAIL_DIAG == where) {
            if (HT[loc] & PARASAIL_DIAG) {
                *(qc++) = missing_char(seqA, i);
                *(dc++) = seqB[j];
                *(ac++) = match_char(seqA, i, seqB, j, matrix, match, pos, neg, case_sensitive, alphabet_aliases, aliases_size);
                --i;
                --j;
            }
            else if (HT[loc] & PARASAIL_INS) {
                where = PARASAIL_INS;
            }
            else if (HT[loc] & PARASAIL_DEL) {
                where = PARASAIL_DEL;
            }
            else {
                break;
            }
        }
        else if (PARASAIL_INS == where) {
            ++c_ins;
            *(qc++) = '-';
            *(dc++) = seqB[j];
            *(ac++) = ' ';
            --j;
            if (HT[loc] & PARASAIL_DIAG_E) {
                where = PARASAIL_DIAG;
            }
            else if (HT[loc] & PARASAIL_INS_E) {
                where = PARASAIL_INS;
            }
            else {
                PARASAIL_ASSERT_NORETVAL(0 && "internal error");
            }
        }
        else if (PARASAIL_DEL == where) {
            ++c_del;
            *(qc++) = missing_char(seqA, i);
            *(dc++) = '-';
            *(ac++) = ' ';
            --i;
            if (HT[loc] & PARASAIL_DIAG_F) {
                where = PARASAIL_DIAG;
            }
            else if (HT[loc] & PARASAIL_DEL_F) {
                where = PARASAIL_DEL;
            }
            else {
                PARASAIL_ASSERT_NORETVAL(0 && "internal error");
            }
        }
        else if (PARASAIL_ZERO == where) {
            break;
        }
        else {
            PARASAIL_ASSERT_NORETVAL(0 && "internal error");
        }
    }
    *(qc++) = '\0';
    *(dc++) = '\0';
    *(ac++) = '\0';

    if (1) {
        char *qr = NULL;
        char *ar = NULL;
        char *dr = NULL;
        int64_t mch = 0;
        int64_t sim = 0;
        int64_t gap = 0;
        int64_t len = strlen(a);
        int64_t q_pindex = 0;
        int64_t d_pindex = 0;
        int64_t qi = 0;
        int64_t ai = 0;
        int64_t di = 0;

        if (result->flag & PARASAIL_FLAG_SW) {
            q_pindex = result->end_query + 1 - len + c_ins;
            d_pindex = result->end_ref + 1 - len + c_del;
        }
        else {
            q_pindex = 0;
            d_pindex = 0;
        }
        qr = parasail_reverse(q, strlen(q));
        ar = parasail_reverse(a, strlen(a));
        dr = parasail_reverse(d, strlen(d));
        for (i=0; i<len; i+=width) {
            fprintf(stream, "\n");
            for (j=0; j<name_width; ++j) {
                if (j >= namelenB) break;
                fprintf(stream, "%c", nameB[j]);
            }
            for (; j<name_width; ++j) {
                fprintf(stream, " ");
            }
            fprintf(stream, " %*lld ", int_width, (long long)d_pindex+1);
            for (j=0; j<len&&j<width&&di<len; ++j) {
                if (dr[di] != '-') ++d_pindex;
                fprintf(stream, "%c", dr[di]);
                ++di;
            }
            fprintf(stream, " %*lld\n", int_width, (long long)d_pindex);
            for (j=0; j<name_width+1+int_width+1; ++j) {
                fprintf(stream, " ");
            }
            for (j=0; j<len&&j<width&&ai<len; ++j) {
                if (ar[ai] == match) { ++mch; ++sim; }
                else if (ar[ai] == pos) ++sim;
                else if (ar[ai] == neg) ;
                else if (ar[ai] == ' ') ++gap;
                else {
                    fprintf(stderr, "bad char in traceback '%c'\n", ar[ai]);
                    PARASAIL_ASSERT_NORETVAL(0 && "internal error");
                }
                fprintf(stream, "%c", ar[ai]);
                ++ai;
            }
            fprintf(stream, "\n");
            for (j=0; j<name_width; ++j) {
                if (j >= namelenA) break;
                fprintf(stream, "%c", nameA[j]);
            }
            for (; j<name_width; ++j) {
                fprintf(stream, " ");
            }
            fprintf(stream, " %*lld ", int_width, (long long)q_pindex+1);
            for (j=0; j<len&&j<width&&qi<len; ++j) {
                if (qr[qi] != '-') ++q_pindex;
                fprintf(stream, "%c", qr[qi]);
                ++qi;
            }
            fprintf(stream, " %*lld\n", int_width, (long long)q_pindex);
        }
        if (use_stats) {
            fprintf(stream, "\n");
            fprintf(stream, "Length: %lld\n", (long long)len);
            fprintf(stream, "Identity:   %*lld/%lld (%4.1f%%)\n", int_width, (long long)mch, (long long)len, 100.0*mch/len);
            fprintf(stream, "Similarity: %*lld/%lld (%4.1f%%)\n", int_width, (long long)sim, (long long)len, 100.0*sim/len);
            fprintf(stream, "Gaps:       %*lld/%lld (%4.1f%%)\n", int_width, (long long)gap, (long long)len, 100.0*gap/len);
            fprintf(stream, "Score: %d\n", result->score);
        }
        free(qr);
        free(ar);
        free(dr);
    }
    else {
        fprintf(stream, "%s\n", q);
        fprintf(stream, "%s\n", a);
        fprintf(stream, "%s\n", d);
    }

    free(q);
    free(d);
    free(a);
}